

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::CatalogSetSecretStorage::StoreSecret
          (CatalogSetSecretStorage *this,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  CatalogTransaction transaction_03;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> _Var4;
  pointer pCVar5;
  pointer pBVar6;
  optional_ptr<duckdb::CatalogEntry,_true> oVar7;
  type pBVar8;
  Catalog *catalog;
  SecretCatalogEntry *this_00;
  pointer pSVar9;
  pointer pSVar10;
  type other;
  SecretEntry *this_01;
  ulong uVar11;
  long *plVar12;
  InternalException *this_02;
  InvalidInputException *this_03;
  size_type *psVar13;
  undefined7 in_register_00000011;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true> *puVar14
  ;
  char *pcVar15;
  optional_ptr<duckdb::CatalogTransaction,_true> in_R8;
  string secret_name;
  LogicalDependencyList l;
  _Head_base<0UL,_duckdb::SecretCatalogEntry_*,_false> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> local_188;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
  *local_180;
  optional_ptr<duckdb::CatalogTransaction,_true> local_178;
  undefined1 local_170 [32];
  float local_150;
  size_t local_148;
  __node_base_ptr p_Stack_140;
  optional_ptr<duckdb::CatalogEntry,_true> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  CatalogTransaction local_d0;
  CatalogTransaction local_a8;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  puVar14 = (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             *)CONCAT71(in_register_00000011,on_conflict);
  local_180 = secret + 7;
  local_188._M_head_impl = (SecretEntry *)this;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)local_180);
  local_178.ptr = in_R8.ptr;
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)secret,in_R8);
  pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar14);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar7 = CatalogSet::GetEntry(pCVar5,transaction_00,&pBVar6->name);
  if (oVar7.ptr != (CatalogEntry *)0x0) {
    switch((ulong)transaction.ptr & 0xff) {
    case 0:
      uVar11 = (ulong)*(byte *)&secret[6].
                                super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                                ._M_t.
                                super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                                .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>.
                                _M_head_impl;
      pcVar15 = "Temporary";
      if (uVar11 != 0) {
        pcVar15 = "Persistent";
      }
      local_170._0_8_ = (long)local_170 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,pcVar15,pcVar15 + uVar11 + 9);
      if (*(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == '\x01'
         ) {
        ::std::operator+(&local_1c8," in secret storage \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (secret + 1));
        plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
        local_1a8._M_dataplus._M_p = (pointer)*plVar12;
        psVar13 = (size_type *)(plVar12 + 2);
        if ((size_type *)local_1a8._M_dataplus._M_p == psVar13) {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8.field_2._8_8_ = plVar12[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
        }
        local_1a8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,anon_var_dwarf_4ed193b + 9);
      }
      this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"%s secret with name \'%s\' already exists%s!","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_170._0_8_,
                 (undefined1 *)((long)(_func_int ***)local_170._0_8_ + local_170._8_8_));
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar14);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar3 = (pBVar6->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (pBVar6->name)._M_string_length);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      InvalidInputException::
      InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_03,(string *)&local_1c8,&local_f0,&local_110,&local_130);
      __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 1:
      *(undefined8 *)local_188._M_head_impl = 0;
      return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>)
             local_188._M_head_impl;
    case 2:
      pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
               operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                           *)local_180);
      GetTransactionOrDefault(&local_80,(CatalogSetSecretStorage *)secret,local_178);
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar14);
      transaction_01.context.ptr = local_80.context.ptr;
      transaction_01.db.ptr = local_80.db.ptr;
      transaction_01.transaction.ptr = local_80.transaction.ptr;
      transaction_01.transaction_id = local_80.transaction_id;
      transaction_01.start_time = local_80.start_time;
      CatalogSet::DropEntry(pCVar5,transaction_01,&pBVar6->name,true,true);
      break;
    case 3:
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_170._0_8_ = (long)local_170 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"unknown OnCreateConflict found while registering secret","");
      InternalException::InternalException(this_02,(string *)local_170);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar8 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator*(puVar14);
  (*(code *)(((secret->
              super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              )._M_t.
              super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
              .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl)->provider).
            field_2._M_allocated_capacity)(secret,pBVar8,(ulong)transaction.ptr & 0xff);
  pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar14);
  pcVar3 = (pBVar6->name)._M_dataplus._M_p;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar3,pcVar3 + (pBVar6->name)._M_string_length);
  catalog = Catalog::GetSystemCatalog
                      ((DatabaseInstance *)
                       secret[8].
                       super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                       ._M_t.
                       super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                       .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl);
  this_00 = (SecretCatalogEntry *)operator_new(0xe8);
  local_170._0_8_ =
       (puVar14->
       super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>).
       _M_t.
       super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
       .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  (puVar14->
  super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)._M_t.
  super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
  .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl = (BaseSecret *)0x0;
  SecretCatalogEntry::SecretCatalogEntry
            (this_00,(unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
                      *)local_170,catalog);
  local_1c8._M_dataplus._M_p = (pointer)this_00;
  if ((_Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>)
      local_170._0_8_ != (BaseSecret *)0x0) {
    (*(*(_func_int ***)local_170._0_8_)[1])();
  }
  bVar1 = *(byte *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  puVar14 = local_180;
  (pSVar9->super_InCatalogEntry).super_CatalogEntry.temporary = (bool)(bVar1 ^ 1);
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  pSVar10 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
            operator->(&pSVar9->secret);
  ::std::__cxx11::string::_M_assign((string *)&pSVar10->storage_mode);
  cVar2 = *(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c8);
  pSVar10 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
            operator->(&pSVar9->secret);
  pSVar10->persist_type = cVar2 + TEMPORARY;
  local_170._0_8_ = &p_Stack_140;
  local_170._8_8_ = 1;
  local_170._16_8_ = (_Hash_node_base *)0x0;
  local_170._24_8_ = 0;
  local_150 = 1.0;
  local_148 = 0;
  p_Stack_140 = (__node_base_ptr)0x0;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar14);
  GetTransactionOrDefault(&local_a8,(CatalogSetSecretStorage *)secret,local_178);
  local_1d0._M_head_impl = (SecretCatalogEntry *)local_1c8._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  transaction_02.context.ptr = local_a8.context.ptr;
  transaction_02.db.ptr = local_a8.db.ptr;
  transaction_02.transaction.ptr = local_a8.transaction.ptr;
  transaction_02.transaction_id = local_a8.transaction_id;
  transaction_02.start_time = local_a8.start_time;
  CatalogSet::CreateEntry
            (pCVar5,transaction_02,&local_1a8,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_1d0,(LogicalDependencyList *)local_170);
  if (local_1d0._M_head_impl != (SecretCatalogEntry *)0x0) {
    (*((local_1d0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_1d0._M_head_impl = (SecretCatalogEntry *)0x0;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar14);
  GetTransactionOrDefault(&local_d0,(CatalogSetSecretStorage *)secret,local_178);
  transaction_03.context.ptr = local_d0.context.ptr;
  transaction_03.db.ptr = local_d0.db.ptr;
  transaction_03.transaction.ptr = local_d0.transaction.ptr;
  transaction_03.transaction_id = local_d0.transaction_id;
  transaction_03.start_time = local_d0.start_time;
  local_138 = CatalogSet::GetEntry(pCVar5,transaction_03,&local_1a8);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_138);
  other = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::operator*
                    ((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>
                      *)&local_138.ptr[1].oid);
  this_01 = (SecretEntry *)operator_new(0x30);
  SecretEntry::SecretEntry(this_01,other);
  _Var4._M_head_impl = local_188._M_head_impl;
  *(SecretEntry **)local_188._M_head_impl = this_01;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_170);
  if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (__uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         _Var4._M_head_impl;
}

Assistant:

unique_ptr<SecretEntry> CatalogSetSecretStorage::StoreSecret(unique_ptr<const BaseSecret> secret,
                                                             OnCreateConflict on_conflict,
                                                             optional_ptr<CatalogTransaction> transaction) {
	if (secrets->GetEntry(GetTransactionOrDefault(transaction), secret->GetName())) {
		if (on_conflict == OnCreateConflict::ERROR_ON_CONFLICT) {
			string persist_string = persistent ? "Persistent" : "Temporary";
			string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
			throw InvalidInputException("%s secret with name '%s' already exists%s!", persist_string, secret->GetName(),
			                            storage_string);
		} else if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
			return nullptr;
		} else if (on_conflict == OnCreateConflict::ALTER_ON_CONFLICT) {
			throw InternalException("unknown OnCreateConflict found while registering secret");
		} else if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
			secrets->DropEntry(GetTransactionOrDefault(transaction), secret->GetName(), true, true);
		}
	}

	// Call write function
	WriteSecret(*secret, on_conflict);

	auto secret_name = secret->GetName();
	auto secret_entry = make_uniq<SecretCatalogEntry>(std::move(secret), Catalog::GetSystemCatalog(db));
	secret_entry->temporary = !persistent;
	secret_entry->secret->storage_mode = storage_name;
	secret_entry->secret->persist_type = persistent ? SecretPersistType::PERSISTENT : SecretPersistType::TEMPORARY;
	LogicalDependencyList l;
	secrets->CreateEntry(GetTransactionOrDefault(transaction), secret_name, std::move(secret_entry), l);

	auto secret_catalog_entry =
	    &secrets->GetEntry(GetTransactionOrDefault(transaction), secret_name)->Cast<SecretCatalogEntry>();
	return make_uniq<SecretEntry>(*secret_catalog_entry->secret);
}